

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O0

void tcg_gen_dupi_vec_ppc64(TCGContext_conflict10 *tcg_ctx,uint vece,TCGv_vec r,uint64_t a)

{
  uint64_t a_00;
  uint64_t a_local;
  TCGv_vec r_local;
  uint vece_local;
  TCGContext_conflict10 *tcg_ctx_local;
  
  a_00 = dup_const_func_ppc64(vece,a);
  do_dupi_vec(tcg_ctx,r,3,a_00);
  return;
}

Assistant:

void tcg_gen_dupi_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, uint64_t a)
{
    do_dupi_vec(tcg_ctx, r, MO_REG, dup_const(vece, a));
}